

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

SelectionSet *
OpenMD::operator|(SelectionSet *__return_storage_ptr__,SelectionSet *ss1,SelectionSet *ss2)

{
  long lVar1;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&__return_storage_ptr__->bitsets_,&ss1->bitsets_);
  for (lVar1 = 0; lVar1 != 0xf0; lVar1 = lVar1 + 0x28) {
    OpenMDBitSet::orOperator
              ((OpenMDBitSet *)
               ((long)&(((__return_storage_ptr__->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar1),
               (OpenMDBitSet *)
               ((long)&(((ss2->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet operator|(const SelectionSet& ss1, const SelectionSet& ss2) {
    SelectionSet result(ss1);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result.bitsets_[i] |= ss2.bitsets_[i];
    return result;
  }